

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void cmAddCacheDefinition(void *arg,char *name,char *value,char *doc,int type)

{
  allocator<char> local_39;
  string local_38;
  
  switch(type) {
  case 0:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,name,&local_39);
    cmMakefile::AddCacheDefinition((cmMakefile *)arg,&local_38,value,doc,BOOL,false);
    break;
  case 1:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,name,&local_39);
    cmMakefile::AddCacheDefinition((cmMakefile *)arg,&local_38,value,doc,PATH,false);
    break;
  case 2:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,name,&local_39);
    cmMakefile::AddCacheDefinition((cmMakefile *)arg,&local_38,value,doc,FILEPATH,false);
    break;
  case 3:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,name,&local_39);
    cmMakefile::AddCacheDefinition((cmMakefile *)arg,&local_38,value,doc,STRING,false);
    break;
  case 4:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,name,&local_39);
    cmMakefile::AddCacheDefinition((cmMakefile *)arg,&local_38,value,doc,INTERNAL,false);
    break;
  case 5:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,name,&local_39);
    cmMakefile::AddCacheDefinition((cmMakefile *)arg,&local_38,value,doc,STATIC,false);
    break;
  default:
    goto switchD_0022a4a6_default;
  }
  std::__cxx11::string::~string((string *)&local_38);
switchD_0022a4a6_default:
  return;
}

Assistant:

void CCONV cmAddCacheDefinition(void* arg, const char* name, const char* value,
                                const char* doc, int type)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);

  switch (type) {
    case CM_CACHE_BOOL:
      mf->AddCacheDefinition(name, value, doc, cmStateEnums::BOOL);
      break;
    case CM_CACHE_PATH:
      mf->AddCacheDefinition(name, value, doc, cmStateEnums::PATH);
      break;
    case CM_CACHE_FILEPATH:
      mf->AddCacheDefinition(name, value, doc, cmStateEnums::FILEPATH);
      break;
    case CM_CACHE_STRING:
      mf->AddCacheDefinition(name, value, doc, cmStateEnums::STRING);
      break;
    case CM_CACHE_INTERNAL:
      mf->AddCacheDefinition(name, value, doc, cmStateEnums::INTERNAL);
      break;
    case CM_CACHE_STATIC:
      mf->AddCacheDefinition(name, value, doc, cmStateEnums::STATIC);
      break;
  }
}